

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_6::ut_pex_peer_plugin::send_ut_peer_list(ut_pex_peer_plugin *this)

{
  torrent *this_00;
  bt_peer_connection *p_00;
  peer_connection *ppVar1;
  bool bVar2;
  int iVar3;
  torrent_flags_t lhs;
  entry *peVar4;
  string_type *psVar5;
  reference pppVar6;
  socket_type *s;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar7;
  counters *pcVar8;
  span<const_char> local_1a8;
  span<const_char> local_198;
  char *local_188;
  char *ptr;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> bStack_178;
  char msg [6];
  undefined1 local_170 [8];
  vector<char,_std::allocator<char>_> pex_msg;
  torrent_peer *pi;
  endpoint remote;
  uint8_t flags;
  bt_peer_connection *p;
  peer_connection *peer;
  peer_iterator __end2;
  peer_iterator __begin2;
  torrent *__range2;
  int num_added;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  plf6_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pla6_out;
  string *plf6;
  string_type *local_c8;
  string *pla6;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  plf_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pla_out;
  string *plf;
  string_type *local_78;
  string *pla;
  string_view local_60;
  undefined1 local_50 [8];
  entry pex;
  unsigned_long local_18;
  ut_pex_peer_plugin *local_10;
  ut_pex_peer_plugin *this_local;
  
  local_10 = this;
  lhs = libtorrent::aux::torrent::flags(this->m_torrent);
  pex.super_variant_type.
  super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  ._M_index = '\0';
  pex.super_variant_type.
  super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  ._33_7_ = 0x2000;
  local_18 = (unsigned_long)
             libtorrent::flags::operator&
                       (lhs.m_val,
                        (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x200000)
  ;
  bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_18);
  if (!bVar2) {
    entry::entry((entry *)local_50);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"dropped");
    peVar4 = entry::operator[]((entry *)local_50,local_60);
    entry::string_abi_cxx11_(peVar4);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&plf,"added");
    peVar4 = entry::operator[]((entry *)local_50,_plf);
    local_78 = entry::string_abi_cxx11_(peVar4);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&pla_out,"added.f");
    peVar4 = entry::operator[]((entry *)local_50,_pla_out);
    psVar5 = entry::string_abi_cxx11_(peVar4);
    ::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator(&plf_out,local_78);
    ::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator(&local_b0,psVar5);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&pla6,"dropped6");
    peVar4 = entry::operator[]((entry *)local_50,_pla6);
    entry::string_abi_cxx11_(peVar4);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&plf6,"added6");
    peVar4 = entry::operator[]((entry *)local_50,_plf6);
    local_c8 = entry::string_abi_cxx11_(peVar4);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&pla6_out,"added6.f");
    peVar4 = entry::operator[]((entry *)local_50,_pla6_out);
    psVar5 = entry::string_abi_cxx11_(peVar4);
    ::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator(&plf6_out,local_c8);
    ::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator
              ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&stack0xffffffffffffff00,psVar5);
    __range2._4_4_ = 0;
    this_00 = this->m_torrent;
    __end2 = libtorrent::aux::torrent::begin(this_00);
    peer = (peer_connection *)libtorrent::aux::torrent::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                       *)&peer), bVar2) {
      pppVar6 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                ::operator*(&__end2);
      p_00 = (bt_peer_connection *)*pppVar6;
      bVar2 = send_peer((peer_connection *)p_00);
      if (bVar2) {
        if (99 < (int)__range2._4_4_) break;
        iVar3 = (*(p_00->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[4])();
        if ((char)iVar3 == '\0') {
          unique0x1000078a = p_00;
          bVar2 = libtorrent::aux::peer_connection::is_seed((peer_connection *)p_00);
          remote.impl_.data_._23_1_ = bVar2 * '\x02';
          bVar2 = libtorrent::aux::bt_peer_connection::supports_encryption(stack0xfffffffffffffed0);
          remote.impl_.data_._23_1_ = remote.impl_.data_._23_1_ | bVar2;
          s = libtorrent::aux::peer_connection::get_socket
                        (&stack0xfffffffffffffed0->super_peer_connection);
          bVar2 = libtorrent::aux::is_utp(s);
          remote.impl_.data_._23_1_ = remote.impl_.data_._23_1_ | bVar2 << 2;
          bVar2 = libtorrent::aux::bt_peer_connection::supports_holepunch(stack0xfffffffffffffed0);
          remote.impl_.data_._23_1_ = remote.impl_.data_._23_1_ | bVar2 << 3;
          iVar3 = (*(p_00->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket
                    [0x10])();
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                    ((basic_endpoint<boost::asio::ip::tcp> *)&pi,
                     (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var,iVar3));
          bVar2 = libtorrent::aux::peer_connection::is_outgoing
                            (&stack0xfffffffffffffed0->super_peer_connection);
          if (!bVar2) {
            iVar3 = (*(p_00->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7]
                    )();
            pex_msg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
                 CONCAT44(extraout_var_00,iVar3);
            if ((pex_msg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ != 0) &&
               (*(short *)(pex_msg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                          0x18) != 0)) {
              boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                        ((basic_endpoint<boost::asio::ip::tcp> *)&pi,
                         *(unsigned_short *)
                          (pex_msg.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                          0x18));
            }
          }
          bVar2 = libtorrent::aux::is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                            ((basic_endpoint<boost::asio::ip::tcp> *)&pi);
          if (bVar2) {
            libtorrent::aux::
            write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                      ((basic_endpoint<boost::asio::ip::tcp> *)&pi,&plf_out);
            libtorrent::aux::
            write_uint8<unsigned_char,std::back_insert_iterator<std::__cxx11::string>>
                      (remote.impl_.data_._23_1_,&local_b0);
          }
          else {
            libtorrent::aux::
            write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                      ((basic_endpoint<boost::asio::ip::tcp> *)&pi,&plf6_out);
            libtorrent::aux::
            write_uint8<unsigned_char,std::back_insert_iterator<std::__cxx11::string>>
                      (remote.impl_.data_._23_1_,
                       (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xffffffffffffff00);
          }
          __range2._4_4_ = __range2._4_4_ + 1;
        }
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&__end2);
    }
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_170);
    bStack_178 = ::std::back_inserter<std::vector<char,std::allocator<char>>>
                           ((vector<char,_std::allocator<char>_> *)local_170);
    bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              (bStack_178,(entry *)local_50);
    local_188 = (char *)((long)&ptr + 2);
    sVar7 = ::std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_170);
    libtorrent::aux::write_uint32<int,char*>((int)sVar7 + 2,&local_188);
    libtorrent::aux::write_uint8<libtorrent::aux::bt_peer_connection::message_type,char*>
              (msg_extended,&local_188);
    libtorrent::aux::write_uint8<int,char*>(this->m_message_index,&local_188);
    ppVar1 = this->m_pc;
    span<char_const>::span<char,6l>((span<char_const> *)&local_198,(char (*) [6])((long)&ptr + 2));
    libtorrent::aux::peer_connection::send_buffer(ppVar1,local_198);
    ppVar1 = this->m_pc;
    span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
              ((span<char_const> *)&local_1a8,(vector<char,_std::allocator<char>_> *)local_170);
    libtorrent::aux::peer_connection::send_buffer(ppVar1,local_1a8);
    pcVar8 = libtorrent::aux::peer_connection::stats_counters(this->m_pc);
    counters::inc_stats_counter(pcVar8,0x67,1);
    pcVar8 = libtorrent::aux::peer_connection::stats_counters(this->m_pc);
    counters::inc_stats_counter(pcVar8,0x65,1);
    ppVar1 = this->m_pc;
    sVar7 = ::std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_170);
    libtorrent::aux::peer_connection::peer_log
              (ppVar1,outgoing_message,"PEX_FULL","added: %d msg_size: %d",(ulong)__range2._4_4_,
               sVar7 & 0xffffffff);
    ::std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_170);
    entry::~entry((entry *)local_50);
  }
  return;
}

Assistant:

void send_ut_peer_list()
		{
			if (m_torrent.flags() & torrent_flags::disable_pex) return;

			entry pex;
			// leave the dropped string empty
			pex["dropped"].string();
			std::string& pla = pex["added"].string();
			std::string& plf = pex["added.f"].string();
			std::back_insert_iterator<std::string> pla_out(pla);
			std::back_insert_iterator<std::string> plf_out(plf);

			pex["dropped6"].string();
			std::string& pla6 = pex["added6"].string();
			std::string& plf6 = pex["added6.f"].string();
			std::back_insert_iterator<std::string> pla6_out(pla6);
			std::back_insert_iterator<std::string> plf6_out(plf6);

			int num_added = 0;
			for (auto const* peer : m_torrent)
			{
				if (!send_peer(*peer)) continue;

				// don't write too big of a package
				if (num_added >= max_peer_entries) break;

				// only send proper bittorrent peers
				if (peer->type() != connection_type::bittorrent)
					continue;

				auto const* const p = static_cast<aux::bt_peer_connection const*>(peer);

				// no supported flags to set yet
				// 0x01 - peer supports encryption
				// 0x02 - peer is a seed
				// 0x04 - supports uTP. This is only a positive flags
				//        passing 0 doesn't mean the peer doesn't
				//        support uTP
				// 0x08 - supports hole punching protocol. If this
				//        flag is received from a peer, it can be
				//        used as a rendezvous point in case direct
				//        connections to the peer fail
				std::uint8_t flags = p->is_seed() ? 2u : 0u;
#if !defined TORRENT_DISABLE_ENCRYPTION
				flags |= p->supports_encryption() ? 1u : 0u;
#endif
				flags |= is_utp(p->get_socket()) ? 4u : 0u;
				flags |= p->supports_holepunch() ? 8u : 0u;

				tcp::endpoint remote = peer->remote();

				if (!p->is_outgoing())
				{
					aux::torrent_peer const* const pi = peer->peer_info_struct();
					if (pi != nullptr && pi->port > 0)
						remote.port(pi->port);
				}

				// i->first was added since the last time
				if (aux::is_v4(remote))
				{
					aux::write_endpoint(remote, pla_out);
					aux::write_uint8(flags, plf_out);
				}
				else
				{
					aux::write_endpoint(remote, pla6_out);
					aux::write_uint8(flags, plf6_out);
				}
				++num_added;
			}
			std::vector<char> pex_msg;
			bencode(std::back_inserter(pex_msg), pex);

			char msg[6];
			char* ptr = msg;

			aux::write_uint32(1 + 1 + int(pex_msg.size()), ptr);
			aux::write_uint8(aux::bt_peer_connection::msg_extended, ptr);
			aux::write_uint8(m_message_index, ptr);
			m_pc.send_buffer(msg);
			m_pc.send_buffer(pex_msg);

			m_pc.stats_counters().inc_stats_counter(counters::num_outgoing_extended);
			m_pc.stats_counters().inc_stats_counter(counters::num_outgoing_pex);

#ifndef TORRENT_DISABLE_LOGGING
			m_pc.peer_log(peer_log_alert::outgoing_message, "PEX_FULL"
				, "added: %d msg_size: %d", num_added, int(pex_msg.size()));
#endif
		}